

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_open.c
# Opt level: O3

TIFF * TIFFClientOpenExt(char *name,char *mode,thandle_t clientdata,TIFFReadWriteProc readproc,
                        TIFFReadWriteProc writeproc,TIFFSeekProc seekproc,TIFFCloseProc closeproc,
                        TIFFSizeProc sizeproc,TIFFMapFileProc mapproc,TIFFUnmapFileProc unmapproc,
                        TIFFOpenOptions *opts)

{
  uint16_t *wp;
  uint64_t *lp;
  byte bVar1;
  ushort uVar2;
  long lVar3;
  void *pvVar4;
  uint16_t uVar5;
  char cVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  long s;
  TIFF *tif;
  tmsize_t tVar10;
  ulong uVar11;
  int iVar12;
  uint32_t uVar13;
  uint64_t uVar14;
  char *pcVar15;
  uint16_t uVar16;
  uint32_t *wp_00;
  byte *pbVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  toff_t n;
  toff_t local_38;
  
  uVar7 = _TIFFgetMode(opts,clientdata,mode,"TIFFClientOpenExt");
  if (uVar7 == 0xffffffff) {
    return (TIFF *)0x0;
  }
  sVar9 = strlen(name);
  s = sVar9 + 0x4f9;
  if ((opts != (TIFFOpenOptions *)0x0) &&
     (lVar3 = opts->max_single_mem_alloc, lVar3 < s && 0 < lVar3)) {
    _TIFFErrorEarly(opts,clientdata,"TIFFClientOpenExt",
                    "%s: Memory allocation of %lu bytes is beyond the %lu byte limit defined in open options"
                    ,name,s,lVar3);
    return (TIFF *)0x0;
  }
  tif = (TIFF *)_TIFFmalloc(s);
  if (tif == (TIFF *)0x0) {
    _TIFFErrorEarly(opts,clientdata,"TIFFClientOpenExt","%s: Out of memory (TIFF structure)",name);
    return (TIFF *)0x0;
  }
  _TIFFmemset(tif,0,0x4f8);
  tif->tif_name = (char *)(tif + 1);
  strcpy((char *)(tif + 1),name);
  tif->tif_mode = uVar7 & 0xfffffdbf;
  tif->tif_curoff = 0;
  tif->tif_curstrip = 0xffffffff;
  tif->tif_row = 0xffffffff;
  tif->tif_curdir = 0xffffffff;
  tif->tif_clientdata = clientdata;
  tif->tif_readproc = readproc;
  tif->tif_writeproc = writeproc;
  tif->tif_seekproc = seekproc;
  tif->tif_closeproc = closeproc;
  tif->tif_sizeproc = sizeproc;
  auVar21._8_8_ = unmapproc;
  auVar21._0_8_ = mapproc;
  auVar18._0_4_ = -(uint)((int)mapproc == 0);
  auVar18._4_4_ = -(uint)((int)((ulong)mapproc >> 0x20) == 0);
  auVar18._8_4_ = -(uint)((int)unmapproc == 0);
  auVar18._12_4_ = -(uint)((int)((ulong)unmapproc >> 0x20) == 0);
  auVar20._4_4_ = auVar18._0_4_;
  auVar20._0_4_ = auVar18._4_4_;
  auVar20._8_4_ = auVar18._12_4_;
  auVar20._12_4_ = auVar18._8_4_;
  auVar22._8_8_ = _tiffDummyUnmapProc;
  auVar22._0_8_ = _tiffDummyMapProc;
  auVar21 = ~(auVar20 & auVar18) & auVar21 | auVar22 & auVar20 & auVar18;
  tif->tif_mapproc = (TIFFMapFileProc)auVar21._0_8_;
  tif->tif_unmapproc = (TIFFUnmapFileProc)auVar21._8_8_;
  if (opts != (TIFFOpenOptions *)0x0) {
    pvVar4 = opts->errorhandler_user_data;
    tif->tif_errorhandler = opts->errorhandler;
    tif->tif_errorhandler_user_data = pvVar4;
    pvVar4 = opts->warnhandler_user_data;
    tif->tif_warnhandler = opts->warnhandler;
    tif->tif_warnhandler_user_data = pvVar4;
    tif->tif_max_single_mem_alloc = opts->max_single_mem_alloc;
  }
  auVar19._0_4_ = -(uint)(readproc == (TIFFReadWriteProc)0x0);
  auVar19._4_4_ = -(uint)(writeproc == (TIFFReadWriteProc)0x0);
  auVar19._8_4_ = -(uint)(seekproc == (TIFFSeekProc)0x0);
  auVar19._12_4_ = -(uint)(closeproc == (TIFFCloseProc)0x0);
  iVar12 = movmskps((int)writeproc,auVar19);
  if (iVar12 != 0 || sizeproc == (TIFFSizeProc)0x0) {
    TIFFErrorExtR(tif,"TIFFClientOpenExt","One of the client procedures is NULL pointer.");
    _TIFFfree(tif);
    return (TIFF *)0x0;
  }
  _TIFFSetDefaultCompressionState(tif);
  uVar8 = (uint)(uVar7 == 0) * 0x800 + 1;
  tif->tif_flags = uVar8;
  pbVar17 = (byte *)mode;
  if ((uVar7 & 0xfffffffd) == 0) {
    uVar8 = uVar8 | 0x8000;
    tif->tif_flags = uVar8;
  }
  do {
    bVar1 = *pbVar17;
    if (0x61 < bVar1) {
      if (0x67 < bVar1) {
        if (bVar1 == 0x68) {
          uVar8 = uVar8 | 0x10000;
        }
        else {
          if ((bVar1 != 0x6d) || (uVar7 != 0)) goto switchD_002aa599_caseD_45;
          uVar8 = uVar8 & 0xfffff7ff;
        }
        goto LAB_002aa647;
      }
      if (bVar1 == 0x62) {
        if ((uVar7 & 0x40) != 0) {
          uVar8 = uVar8 | 0x80;
          goto LAB_002aa647;
        }
      }
      else if ((bVar1 == 99) && (uVar7 == 0)) {
        uVar8 = uVar8 & 0xffff7fff;
        goto LAB_002aa647;
      }
      goto switchD_002aa599_caseD_45;
    }
    switch(bVar1) {
    case 0x42:
      goto switchD_002aa599_caseD_42;
    case 0x43:
      if (uVar7 == 0) {
        uVar8 = uVar8 | 0x8000;
        goto LAB_002aa647;
      }
      break;
    case 0x44:
      uVar8 = uVar8 | 0x1000000;
      goto LAB_002aa647;
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4e:
      break;
    case 0x48:
      TIFFWarningExtR(tif,name,
                      "H(ost) mode is deprecated. Since libtiff 4.5.1, it is an alias of \'B\' / FILLORDER_MSB2LSB."
                     );
      uVar8 = tif->tif_flags;
switchD_002aa599_caseD_42:
      uVar8 = (uVar8 & 0xfffffffc) + 1;
      goto LAB_002aa647;
    case 0x4c:
      uVar8 = uVar8 & 0xfffffffc | 2;
LAB_002aa647:
      tif->tif_flags = uVar8;
      break;
    case 0x4d:
      if (uVar7 == 0) {
        uVar8 = uVar8 | 0x800;
        goto LAB_002aa647;
      }
      break;
    case 0x4f:
      if (uVar7 == 0) {
        uVar8 = uVar8 | 0x3000000;
        goto LAB_002aa647;
      }
      break;
    default:
      if (bVar1 == 0x38) {
        if ((uVar7 & 0x40) != 0) {
          uVar8 = uVar8 | 0x80000;
          goto LAB_002aa647;
        }
      }
      else if (bVar1 == 0) goto code_r0x002aa656;
    }
switchD_002aa599_caseD_45:
    pbVar17 = pbVar17 + 1;
  } while( true );
code_r0x002aa656:
  if ((uVar7 >> 9 & 1) == 0) {
    tVar10 = (*tif->tif_readproc)(tif->tif_clientdata,&tif->tif_header,8);
    if (tVar10 != 8) goto LAB_002aa6f3;
    uVar2 = (tif->tif_header).common.tiff_magic;
    uVar11 = (ulong)uVar2;
    if (uVar2 != 0x4949) {
      if (uVar2 == 0x4d4d) {
        *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 0x80;
LAB_002aa801:
        TIFFSwabShort(&(tif->tif_header).common.tiff_version);
        goto LAB_002aa80d;
      }
      pcVar15 = "Not a TIFF file, bad magic number %u (0x%x)";
LAB_002aa8ad:
      TIFFErrorExtR(tif,name,pcVar15,uVar11,uVar11);
      goto LAB_002aa933;
    }
    if ((tif->tif_flags & 0x80) != 0) goto LAB_002aa801;
LAB_002aa80d:
    uVar2 = (tif->tif_header).common.tiff_version;
    uVar11 = (ulong)uVar2;
    if ((uVar2 & 0xfffe) != 0x2a) {
      pcVar15 = "Not a TIFF file, bad version number %u (0x%x)";
      goto LAB_002aa8ad;
    }
    if (uVar2 == 0x2a) {
      uVar7 = tif->tif_flags;
      if ((char)uVar7 < '\0') {
        TIFFSwabLong(&(tif->tif_header).classic.tiff_diroff);
        uVar7 = tif->tif_flags;
      }
      tif->tif_header_size = 8;
LAB_002aa847:
      uVar13 = uVar7 | 0x200;
      tif->tif_flags = uVar13;
      tif->tif_rawdata = (uint8_t *)0x0;
      tif->tif_rawdatasize = 0;
      tif->tif_rawdataoff = 0;
      tif->tif_rawdataloaded = 0;
      tif->tif_rawcp = (uint8_t *)0x0;
      if (*mode == 'a') {
        iVar12 = TIFFDefaultDirectory(tif);
      }
      else {
        if (*mode != 'r') goto LAB_002aa933;
        if ((uVar7 >> 0x13 & 1) == 0) {
          uVar14 = (uint64_t)(tif->tif_header).classic.tiff_diroff;
        }
        else {
          uVar14 = (tif->tif_header).big.tiff_diroff;
        }
        tif->tif_nextdiroff = uVar14;
        if ((uVar7 >> 0xb & 1) != 0) {
          iVar12 = (*tif->tif_mapproc)(tif->tif_clientdata,&tif->tif_base,&local_38);
          if (iVar12 == 0) {
            uVar13 = tif->tif_flags & 0xfffff7ff;
            tif->tif_flags = uVar13;
          }
          else {
            tif->tif_size = local_38;
            uVar13 = tif->tif_flags;
          }
        }
        if ((uVar13 >> 0x10 & 1) != 0) {
          return tif;
        }
        iVar12 = TIFFReadDirectory(tif);
      }
      if (iVar12 != 0) {
        return tif;
      }
      goto LAB_002aa933;
    }
    lp = &(tif->tif_header).big.tiff_diroff;
    tVar10 = (*tif->tif_readproc)(tif->tif_clientdata,lp,8);
    if (tVar10 == 8) {
      if ((tif->tif_flags & 0x80) != 0) {
        TIFFSwabShort(&(tif->tif_header).big.tiff_offsetsize);
        TIFFSwabLong8(lp);
      }
      uVar2 = (tif->tif_header).big.tiff_offsetsize;
      uVar11 = (ulong)uVar2;
      if (uVar2 == 8) {
        uVar2 = (tif->tif_header).big.tiff_unused;
        uVar11 = (ulong)uVar2;
        if (uVar2 == 0) {
          tif->tif_header_size = 0x10;
          uVar7 = tif->tif_flags | 0x80000;
          goto LAB_002aa847;
        }
        pcVar15 = "Not a TIFF file, bad BigTIFF unused %u (0x%x)";
      }
      else {
        pcVar15 = "Not a TIFF file, bad BigTIFF offsetsize %u (0x%x)";
      }
      goto LAB_002aa8ad;
    }
LAB_002aa91f:
    pcVar15 = "Cannot read TIFF header";
  }
  else {
LAB_002aa6f3:
    if (tif->tif_mode == 0) goto LAB_002aa91f;
    uVar7 = tif->tif_flags;
    cVar6 = (char)uVar7;
    uVar16 = 0x4d4d;
    if (-1 < cVar6) {
      uVar16 = 0x4949;
    }
    (tif->tif_header).common.tiff_magic = uVar16;
    wp = &(tif->tif_header).common.tiff_version;
    wp_00 = &(tif->tif_header).classic.tiff_diroff;
    if ((uVar7 >> 0x13 & 1) == 0) {
      *wp = 0x2a;
      *wp_00 = 0;
      uVar16 = 8;
      wp_00 = (uint32_t *)wp;
      uVar5 = 8;
      if (cVar6 < '\0') {
LAB_002aa77d:
        uVar16 = uVar5;
        TIFFSwabShort((uint16_t *)wp_00);
      }
    }
    else {
      *(undefined4 *)((long)&tif->tif_header + 2) = 0x8002b;
      (tif->tif_header).big.tiff_unused = 0;
      (tif->tif_header).big.tiff_diroff = 0;
      uVar16 = 0x10;
      if (cVar6 < '\0') {
        TIFFSwabShort(wp);
        uVar5 = 0x10;
        goto LAB_002aa77d;
      }
    }
    tif->tif_header_size = uVar16;
    (*tif->tif_seekproc)(tif->tif_clientdata,0,0);
    uVar11 = (*tif->tif_writeproc)
                       (tif->tif_clientdata,&tif->tif_header,(tmsize_t)tif->tif_header_size);
    if (uVar11 == tif->tif_header_size) {
      if ((tif->tif_header).common.tiff_magic == 0x4d4d) {
        *(byte *)&tif->tif_flags = (byte)tif->tif_flags | 0x80;
      }
      iVar12 = TIFFDefaultDirectory(tif);
      if (iVar12 != 0) {
        tif->tif_diroff = 0;
        tif->tif_lastdiroff = 0;
        tif->tif_setdirectory_force_absolute = 0;
        return tif;
      }
      goto LAB_002aa933;
    }
    pcVar15 = "Error writing TIFF header";
  }
  TIFFErrorExtR(tif,name,pcVar15);
LAB_002aa933:
  tif->tif_mode = 0;
  TIFFCleanup(tif);
  return (TIFF *)0x0;
}

Assistant:

TIFF *TIFFClientOpenExt(const char *name, const char *mode,
                        thandle_t clientdata, TIFFReadWriteProc readproc,
                        TIFFReadWriteProc writeproc, TIFFSeekProc seekproc,
                        TIFFCloseProc closeproc, TIFFSizeProc sizeproc,
                        TIFFMapFileProc mapproc, TIFFUnmapFileProc unmapproc,
                        TIFFOpenOptions *opts)
{
    static const char module[] = "TIFFClientOpenExt";
    TIFF *tif;
    int m;
    const char *cp;

    /* The following are configuration checks. They should be redundant, but
     * should not compile to any actual code in an optimised release build
     * anyway. If any of them fail, (makefile-based or other) configuration is
     * not correct */
    assert(sizeof(uint8_t) == 1);
    assert(sizeof(int8_t) == 1);
    assert(sizeof(uint16_t) == 2);
    assert(sizeof(int16_t) == 2);
    assert(sizeof(uint32_t) == 4);
    assert(sizeof(int32_t) == 4);
    assert(sizeof(uint64_t) == 8);
    assert(sizeof(int64_t) == 8);
    {
        union
        {
            uint8_t a8[2];
            uint16_t a16;
        } n;
        n.a8[0] = 1;
        n.a8[1] = 0;
        (void)n;
#ifdef WORDS_BIGENDIAN
        assert(n.a16 == 256);
#else
        assert(n.a16 == 1);
#endif
    }

    m = _TIFFgetMode(opts, clientdata, mode, module);
    if (m == -1)
        goto bad2;
    tmsize_t size_to_alloc = (tmsize_t)(sizeof(TIFF) + strlen(name) + 1);
    if (opts && opts->max_single_mem_alloc > 0 &&
        size_to_alloc > opts->max_single_mem_alloc)
    {
        _TIFFErrorEarly(opts, clientdata, module,
                        "%s: Memory allocation of %" PRIu64
                        " bytes is beyond the %" PRIu64
                        " byte limit defined in open options",
                        name, (uint64_t)size_to_alloc,
                        (uint64_t)opts->max_single_mem_alloc);
        goto bad2;
    }
    tif = (TIFF *)_TIFFmallocExt(NULL, size_to_alloc);
    if (tif == NULL)
    {
        _TIFFErrorEarly(opts, clientdata, module,
                        "%s: Out of memory (TIFF structure)", name);
        goto bad2;
    }
    _TIFFmemset(tif, 0, sizeof(*tif));
    tif->tif_name = (char *)tif + sizeof(TIFF);
    strcpy(tif->tif_name, name);
    tif->tif_mode = m & ~(O_CREAT | O_TRUNC);
    tif->tif_curdir = TIFF_NON_EXISTENT_DIR_NUMBER; /* non-existent directory */
    tif->tif_curoff = 0;
    tif->tif_curstrip = (uint32_t)-1; /* invalid strip */
    tif->tif_row = (uint32_t)-1;      /* read/write pre-increment */
    tif->tif_clientdata = clientdata;
    tif->tif_readproc = readproc;
    tif->tif_writeproc = writeproc;
    tif->tif_seekproc = seekproc;
    tif->tif_closeproc = closeproc;
    tif->tif_sizeproc = sizeproc;
    tif->tif_mapproc = mapproc ? mapproc : _tiffDummyMapProc;
    tif->tif_unmapproc = unmapproc ? unmapproc : _tiffDummyUnmapProc;
    if (opts)
    {
        tif->tif_errorhandler = opts->errorhandler;
        tif->tif_errorhandler_user_data = opts->errorhandler_user_data;
        tif->tif_warnhandler = opts->warnhandler;
        tif->tif_warnhandler_user_data = opts->warnhandler_user_data;
        tif->tif_max_single_mem_alloc = opts->max_single_mem_alloc;
    }

    if (!readproc || !writeproc || !seekproc || !closeproc || !sizeproc)
    {
        TIFFErrorExtR(tif, module,
                      "One of the client procedures is NULL pointer.");
        _TIFFfreeExt(NULL, tif);
        goto bad2;
    }

    _TIFFSetDefaultCompressionState(tif); /* setup default state */
    /*
     * Default is to return data MSB2LSB and enable the
     * use of memory-mapped files and strip chopping when
     * a file is opened read-only.
     */
    tif->tif_flags = FILLORDER_MSB2LSB;
    if (m == O_RDONLY)
        tif->tif_flags |= TIFF_MAPPED;

#ifdef STRIPCHOP_DEFAULT
    if (m == O_RDONLY || m == O_RDWR)
        tif->tif_flags |= STRIPCHOP_DEFAULT;
#endif

    /*
     * Process library-specific flags in the open mode string.
     * The following flags may be used to control intrinsic library
     * behavior that may or may not be desirable (usually for
     * compatibility with some application that claims to support
     * TIFF but only supports some brain dead idea of what the
     * vendor thinks TIFF is):
     *
     * 'l' use little-endian byte order for creating a file
     * 'b' use big-endian byte order for creating a file
     * 'L' read/write information using LSB2MSB bit order
     * 'B' read/write information using MSB2LSB bit order
     * 'H' read/write information using host bit order
     * 'M' enable use of memory-mapped files when supported
     * 'm' disable use of memory-mapped files
     * 'C' enable strip chopping support when reading
     * 'c' disable strip chopping support
     * 'h' read TIFF header only, do not load the first IFD
     * '4' ClassicTIFF for creating a file (default)
     * '8' BigTIFF for creating a file
     * 'D' enable use of deferred strip/tile offset/bytecount array loading.
     * 'O' on-demand loading of values instead of whole array loading (implies
     * D)
     *
     * The use of the 'l' and 'b' flags is strongly discouraged.
     * These flags are provided solely because numerous vendors,
     * typically on the PC, do not correctly support TIFF; they
     * only support the Intel little-endian byte order.  This
     * support is not configured by default because it supports
     * the violation of the TIFF spec that says that readers *MUST*
     * support both byte orders.  It is strongly recommended that
     * you not use this feature except to deal with busted apps
     * that write invalid TIFF.  And even in those cases you should
     * bang on the vendors to fix their software.
     *
     * The 'L', 'B', and 'H' flags are intended for applications
     * that can optimize operations on data by using a particular
     * bit order.  By default the library returns data in MSB2LSB
     * bit order for compatibility with older versions of this
     * library.  Returning data in the bit order of the native CPU
     * makes the most sense but also requires applications to check
     * the value of the FillOrder tag; something they probably do
     * not do right now.
     *
     * The 'M' and 'm' flags are provided because some virtual memory
     * systems exhibit poor behavior when large images are mapped.
     * These options permit clients to control the use of memory-mapped
     * files on a per-file basis.
     *
     * The 'C' and 'c' flags are provided because the library support
     * for chopping up large strips into multiple smaller strips is not
     * application-transparent and as such can cause problems.  The 'c'
     * option permits applications that only want to look at the tags,
     * for example, to get the unadulterated TIFF tag information.
     */
    for (cp = mode; *cp; cp++)
        switch (*cp)
        {
            case 'b':
#ifndef WORDS_BIGENDIAN
                if (m & O_CREAT)
                    tif->tif_flags |= TIFF_SWAB;
#endif
                break;
            case 'l':
#ifdef WORDS_BIGENDIAN
                if ((m & O_CREAT))
                    tif->tif_flags |= TIFF_SWAB;
#endif
                break;
            case 'B':
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_MSB2LSB;
                break;
            case 'L':
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_LSB2MSB;
                break;
            case 'H':
                TIFFWarningExtR(tif, name,
                                "H(ost) mode is deprecated. Since "
                                "libtiff 4.5.1, it is an alias of 'B' / "
                                "FILLORDER_MSB2LSB.");
                tif->tif_flags =
                    (tif->tif_flags & ~TIFF_FILLORDER) | FILLORDER_MSB2LSB;
                break;
            case 'M':
                if (m == O_RDONLY)
                    tif->tif_flags |= TIFF_MAPPED;
                break;
            case 'm':
                if (m == O_RDONLY)
                    tif->tif_flags &= ~TIFF_MAPPED;
                break;
            case 'C':
                if (m == O_RDONLY)
                    tif->tif_flags |= TIFF_STRIPCHOP;
                break;
            case 'c':
                if (m == O_RDONLY)
                    tif->tif_flags &= ~TIFF_STRIPCHOP;
                break;
            case 'h':
                tif->tif_flags |= TIFF_HEADERONLY;
                break;
            case '8':
                if (m & O_CREAT)
                    tif->tif_flags |= TIFF_BIGTIFF;
                break;
            case 'D':
                tif->tif_flags |= TIFF_DEFERSTRILELOAD;
                break;
            case 'O':
                if (m == O_RDONLY)
                    tif->tif_flags |=
                        (TIFF_LAZYSTRILELOAD | TIFF_DEFERSTRILELOAD);
                break;
        }

#ifdef DEFER_STRILE_LOAD
    /* Compatibility with old DEFER_STRILE_LOAD compilation flag */
    /* Probably unneeded, since to the best of my knowledge (E. Rouault) */
    /* GDAL was the only user of this, and will now use the new 'D' flag */
    tif->tif_flags |= TIFF_DEFERSTRILELOAD;
#endif

    /*
     * Read in TIFF header.
     */
    if ((m & O_TRUNC) ||
        !ReadOK(tif, &tif->tif_header, sizeof(TIFFHeaderClassic)))
    {
        if (tif->tif_mode == O_RDONLY)
        {
            TIFFErrorExtR(tif, name, "Cannot read TIFF header");
            goto bad;
        }
/*
 * Setup header and write.
 */
#ifdef WORDS_BIGENDIAN
        tif->tif_header.common.tiff_magic =
            (tif->tif_flags & TIFF_SWAB) ? TIFF_LITTLEENDIAN : TIFF_BIGENDIAN;
#else
        tif->tif_header.common.tiff_magic =
            (tif->tif_flags & TIFF_SWAB) ? TIFF_BIGENDIAN : TIFF_LITTLEENDIAN;
#endif
        if (!(tif->tif_flags & TIFF_BIGTIFF))
        {
            tif->tif_header.common.tiff_version = TIFF_VERSION_CLASSIC;
            tif->tif_header.classic.tiff_diroff = 0;
            if (tif->tif_flags & TIFF_SWAB)
                TIFFSwabShort(&tif->tif_header.common.tiff_version);
            tif->tif_header_size = sizeof(TIFFHeaderClassic);
        }
        else
        {
            tif->tif_header.common.tiff_version = TIFF_VERSION_BIG;
            tif->tif_header.big.tiff_offsetsize = 8;
            tif->tif_header.big.tiff_unused = 0;
            tif->tif_header.big.tiff_diroff = 0;
            if (tif->tif_flags & TIFF_SWAB)
            {
                TIFFSwabShort(&tif->tif_header.common.tiff_version);
                TIFFSwabShort(&tif->tif_header.big.tiff_offsetsize);
            }
            tif->tif_header_size = sizeof(TIFFHeaderBig);
        }
        /*
         * The doc for "fopen" for some STD_C_LIBs says that if you
         * open a file for modify ("+"), then you must fseek (or
         * fflush?) between any freads and fwrites.  This is not
         * necessary on most systems, but has been shown to be needed
         * on Solaris.
         */
        TIFFSeekFile(tif, 0, SEEK_SET);
        if (!WriteOK(tif, &tif->tif_header, (tmsize_t)(tif->tif_header_size)))
        {
            TIFFErrorExtR(tif, name, "Error writing TIFF header");
            goto bad;
        }
        /*
         * Setup the byte order handling.
         */
        if (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN)
        {
#ifndef WORDS_BIGENDIAN
            tif->tif_flags |= TIFF_SWAB;
#endif
        }
        else
        {
#ifdef WORDS_BIGENDIAN
            tif->tif_flags |= TIFF_SWAB;
#endif
        }
        /*
         * Setup default directory.
         */
        if (!TIFFDefaultDirectory(tif))
            goto bad;
        tif->tif_diroff = 0;
        tif->tif_lastdiroff = 0;
        tif->tif_setdirectory_force_absolute = FALSE;
        return (tif);
    }
    /*
     * Setup the byte order handling.
     */
    if (tif->tif_header.common.tiff_magic != TIFF_BIGENDIAN &&
        tif->tif_header.common.tiff_magic != TIFF_LITTLEENDIAN
#if MDI_SUPPORT
        &&
#if HOST_BIGENDIAN
        tif->tif_header.common.tiff_magic != MDI_BIGENDIAN
#else
        tif->tif_header.common.tiff_magic != MDI_LITTLEENDIAN
#endif
    )
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF or MDI file, bad magic number %" PRIu16
                      " (0x%" PRIx16 ")",
#else
    )
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF file, bad magic number %" PRIu16
                      " (0x%" PRIx16 ")",
#endif
                      tif->tif_header.common.tiff_magic,
                      tif->tif_header.common.tiff_magic);
        goto bad;
    }
    if (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN)
    {
#ifndef WORDS_BIGENDIAN
        tif->tif_flags |= TIFF_SWAB;
#endif
    }
    else
    {
#ifdef WORDS_BIGENDIAN
        tif->tif_flags |= TIFF_SWAB;
#endif
    }
    if (tif->tif_flags & TIFF_SWAB)
        TIFFSwabShort(&tif->tif_header.common.tiff_version);
    if ((tif->tif_header.common.tiff_version != TIFF_VERSION_CLASSIC) &&
        (tif->tif_header.common.tiff_version != TIFF_VERSION_BIG))
    {
        TIFFErrorExtR(tif, name,
                      "Not a TIFF file, bad version number %" PRIu16
                      " (0x%" PRIx16 ")",
                      tif->tif_header.common.tiff_version,
                      tif->tif_header.common.tiff_version);
        goto bad;
    }
    if (tif->tif_header.common.tiff_version == TIFF_VERSION_CLASSIC)
    {
        if (tif->tif_flags & TIFF_SWAB)
            TIFFSwabLong(&tif->tif_header.classic.tiff_diroff);
        tif->tif_header_size = sizeof(TIFFHeaderClassic);
    }
    else
    {
        if (!ReadOK(tif,
                    ((uint8_t *)(&tif->tif_header) + sizeof(TIFFHeaderClassic)),
                    (sizeof(TIFFHeaderBig) - sizeof(TIFFHeaderClassic))))
        {
            TIFFErrorExtR(tif, name, "Cannot read TIFF header");
            goto bad;
        }
        if (tif->tif_flags & TIFF_SWAB)
        {
            TIFFSwabShort(&tif->tif_header.big.tiff_offsetsize);
            TIFFSwabLong8(&tif->tif_header.big.tiff_diroff);
        }
        if (tif->tif_header.big.tiff_offsetsize != 8)
        {
            TIFFErrorExtR(tif, name,
                          "Not a TIFF file, bad BigTIFF offsetsize %" PRIu16
                          " (0x%" PRIx16 ")",
                          tif->tif_header.big.tiff_offsetsize,
                          tif->tif_header.big.tiff_offsetsize);
            goto bad;
        }
        if (tif->tif_header.big.tiff_unused != 0)
        {
            TIFFErrorExtR(tif, name,
                          "Not a TIFF file, bad BigTIFF unused %" PRIu16
                          " (0x%" PRIx16 ")",
                          tif->tif_header.big.tiff_unused,
                          tif->tif_header.big.tiff_unused);
            goto bad;
        }
        tif->tif_header_size = sizeof(TIFFHeaderBig);
        tif->tif_flags |= TIFF_BIGTIFF;
    }
    tif->tif_flags |= TIFF_MYBUFFER;
    tif->tif_rawcp = tif->tif_rawdata = 0;
    tif->tif_rawdatasize = 0;
    tif->tif_rawdataoff = 0;
    tif->tif_rawdataloaded = 0;

    switch (mode[0])
    {
        case 'r':
            if (!(tif->tif_flags & TIFF_BIGTIFF))
                tif->tif_nextdiroff = tif->tif_header.classic.tiff_diroff;
            else
                tif->tif_nextdiroff = tif->tif_header.big.tiff_diroff;
            /*
             * Try to use a memory-mapped file if the client
             * has not explicitly suppressed usage with the
             * 'm' flag in the open mode (see above).
             */
            if (tif->tif_flags & TIFF_MAPPED)
            {
                toff_t n;
                if (TIFFMapFileContents(tif, (void **)(&tif->tif_base), &n))
                {
                    tif->tif_size = (tmsize_t)n;
                    assert((toff_t)tif->tif_size == n);
                }
                else
                    tif->tif_flags &= ~TIFF_MAPPED;
            }
            /*
             * Sometimes we do not want to read the first directory (for
             * example, it may be broken) and want to proceed to other
             * directories. I this case we use the TIFF_HEADERONLY flag to open
             * file and return immediately after reading TIFF header.
             */
            if (tif->tif_flags & TIFF_HEADERONLY)
                return (tif);

            /*
             * Setup initial directory.
             */
            if (TIFFReadDirectory(tif))
            {
                return (tif);
            }
            break;
        case 'a':
            /*
             * New directories are automatically append
             * to the end of the directory chain when they
             * are written out (see TIFFWriteDirectory).
             */
            if (!TIFFDefaultDirectory(tif))
                goto bad;
            return (tif);
    }
bad:
    tif->tif_mode = O_RDONLY; /* XXX avoid flush */
    TIFFCleanup(tif);
bad2:
    return ((TIFF *)0);
}

/*
 * Query functions to access private data.
 */

/*
 * Return open file's name.
 */
const char *TIFFFileName(TIFF *tif) { return (tif->tif_name); }

/*
 * Set the file name.
 */
const char *TIFFSetFileName(TIFF *tif, const char *name)
{
    const char *old_name = tif->tif_name;
    tif->tif_name = (char *)name;
    return (old_name);
}

/*
 * Return open file's I/O descriptor.
 */
int TIFFFileno(TIFF *tif) { return (tif->tif_fd); }

/*
 * Set open file's I/O descriptor, and return previous value.
 */
int TIFFSetFileno(TIFF *tif, int fd)
{
    int old_fd = tif->tif_fd;
    tif->tif_fd = fd;
    return old_fd;
}

/*
 * Return open file's clientdata.
 */
thandle_t TIFFClientdata(TIFF *tif) { return (tif->tif_clientdata); }

/*
 * Set open file's clientdata, and return previous value.
 */
thandle_t TIFFSetClientdata(TIFF *tif, thandle_t newvalue)
{
    thandle_t m = tif->tif_clientdata;
    tif->tif_clientdata = newvalue;
    return m;
}

/*
 * Return read/write mode.
 */
int TIFFGetMode(TIFF *tif) { return (tif->tif_mode); }

/*
 * Return read/write mode.
 */
int TIFFSetMode(TIFF *tif, int mode)
{
    int old_mode = tif->tif_mode;
    tif->tif_mode = mode;
    return (old_mode);
}

/*
 * Return nonzero if file is organized in
 * tiles; zero if organized as strips.
 */
int TIFFIsTiled(TIFF *tif) { return (isTiled(tif)); }

/*
 * Return current row being read/written.
 */
uint32_t TIFFCurrentRow(TIFF *tif) { return (tif->tif_row); }

/*
 * Return index of the current directory.
 */
tdir_t TIFFCurrentDirectory(TIFF *tif) { return (tif->tif_curdir); }

/*
 * Return current strip.
 */
uint32_t TIFFCurrentStrip(TIFF *tif) { return (tif->tif_curstrip); }

/*
 * Return current tile.
 */
uint32_t TIFFCurrentTile(TIFF *tif) { return (tif->tif_curtile); }

/*
 * Return nonzero if the file has byte-swapped data.
 */
int TIFFIsByteSwapped(TIFF *tif) { return ((tif->tif_flags & TIFF_SWAB) != 0); }

/*
 * Return nonzero if the data is returned up-sampled.
 */
int TIFFIsUpSampled(TIFF *tif) { return (isUpSampled(tif)); }

/*
 * Return nonzero if the data is returned in MSB-to-LSB bit order.
 */
int TIFFIsMSB2LSB(TIFF *tif) { return (isFillOrder(tif, FILLORDER_MSB2LSB)); }

/*
 * Return nonzero if given file was written in big-endian order.
 */
int TIFFIsBigEndian(TIFF *tif)
{
    return (tif->tif_header.common.tiff_magic == TIFF_BIGENDIAN);
}

/*
 * Return nonzero if given file is BigTIFF style.
 */
int TIFFIsBigTIFF(TIFF *tif)
{
    return (tif->tif_header.common.tiff_version == TIFF_VERSION_BIG);
}

/*
 * Return pointer to file read method.
 */
TIFFReadWriteProc TIFFGetReadProc(TIFF *tif) { return (tif->tif_readproc); }

/*
 * Return pointer to file write method.
 */
TIFFReadWriteProc TIFFGetWriteProc(TIFF *tif) { return (tif->tif_writeproc); }

/*
 * Return pointer to file seek method.
 */
TIFFSeekProc TIFFGetSeekProc(TIFF *tif) { return (tif->tif_seekproc); }

/*
 * Return pointer to file close method.
 */
TIFFCloseProc TIFFGetCloseProc(TIFF *tif) { return (tif->tif_closeproc); }

/*
 * Return pointer to file size requesting method.
 */
TIFFSizeProc TIFFGetSizeProc(TIFF *tif) { return (tif->tif_sizeproc); }

/*
 * Return pointer to memory mapping method.
 */
TIFFMapFileProc TIFFGetMapFileProc(TIFF *tif) { return (tif->tif_mapproc); }

/*
 * Return pointer to memory unmapping method.
 */
TIFFUnmapFileProc TIFFGetUnmapFileProc(TIFF *tif)
{
    return (tif->tif_unmapproc);
}